

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

bool google::protobuf::compiler::ruby::MaybeEmitDependency
               (FileDescriptor *import,FileDescriptor *from,Printer *printer,string *error)

{
  int iVar1;
  bool bVar2;
  Syntax SVar3;
  int iVar4;
  Descriptor *message;
  LogMessage *pLVar5;
  string *psVar6;
  string *proto_file;
  string local_c8;
  LogFinisher local_a1;
  string local_a0;
  LogMessage local_70;
  int local_34;
  string *psStack_30;
  int i;
  string *error_local;
  Printer *printer_local;
  FileDescriptor *from_local;
  FileDescriptor *import_local;
  
  psStack_30 = error;
  error_local = (string *)printer;
  printer_local = (Printer *)from;
  from_local = import;
  SVar3 = FileDescriptor::syntax(import);
  psVar6 = error_local;
  if (SVar3 == SYNTAX_PROTO2) {
    for (local_34 = 0; iVar1 = local_34,
        iVar4 = FileDescriptor::message_type_count((FileDescriptor *)printer_local), iVar1 < iVar4;
        local_34 = local_34 + 1) {
      message = FileDescriptor::message_type((FileDescriptor *)printer_local,local_34);
      bVar2 = UsesTypeFromFile(message,from_local,psStack_30);
      if (bVar2) {
        return false;
      }
    }
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
               ,0x1a8);
    pLVar5 = internal::LogMessage::operator<<(&local_70,"Omitting proto2 dependency \'");
    psVar6 = FileDescriptor::name_abi_cxx11_(from_local);
    pLVar5 = internal::LogMessage::operator<<(pLVar5,psVar6);
    pLVar5 = internal::LogMessage::operator<<(pLVar5,"\' from proto3 output file \'");
    psVar6 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)printer_local);
    GetOutputFilename(&local_a0,psVar6);
    pLVar5 = internal::LogMessage::operator<<(pLVar5,&local_a0);
    pLVar5 = internal::LogMessage::operator<<
                       (pLVar5,
                        "\' because we don\'t support proto2 and no proto2 types from that file are being used."
                       );
    internal::LogFinisher::operator=(&local_a1,pLVar5);
    std::__cxx11::string::~string((string *)&local_a0);
    internal::LogMessage::~LogMessage(&local_70);
  }
  else {
    proto_file = FileDescriptor::name_abi_cxx11_(from_local);
    GetRequireName(&local_c8,proto_file);
    io::Printer::Print((Printer *)psVar6,"require \'$name$\'\n","name",&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  return true;
}

Assistant:

bool MaybeEmitDependency(const FileDescriptor* import,
                         const FileDescriptor* from,
                         io::Printer* printer,
                         string* error) {
  if (import->syntax() == FileDescriptor::SYNTAX_PROTO2) {
    for (int i = 0; i < from->message_type_count(); i++) {
      if (UsesTypeFromFile(from->message_type(i), import, error)) {
        // Error text was already set by UsesTypeFromFile().
        return false;
      }
    }

    // Ok to omit this proto2 dependency -- so we won't print anything.
    GOOGLE_LOG(WARNING) << "Omitting proto2 dependency '" << import->name()
                        << "' from proto3 output file '"
                        << GetOutputFilename(from->name())
                        << "' because we don't support proto2 and no proto2 "
                           "types from that file are being used.";
    return true;
  } else {
    printer->Print(
      "require '$name$'\n", "name", GetRequireName(import->name()));
    return true;
  }
}